

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O1

void nrg::PrioExecution::push<void(*)()>(Queue *queue,_func_void *fn)

{
  QueueElement elem;
  _Any_data local_60;
  _Manager_type local_50;
  _Invoker_type p_Stack_48;
  QueueElement local_40;
  
  local_60._M_unused._M_object = (_func_void *)0x0;
  local_60._8_8_ = 0;
  local_50 = (_Manager_type)0x0;
  p_Stack_48 = (_Invoker_type)0x0;
  if (fn != (_func_void *)0x0) {
    p_Stack_48 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
    local_50 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
    local_60._M_unused._M_function_pointer = fn;
  }
  local_40._0_8_ = (ulong)next()::nxt << 0x20;
  local_40.what.super__Function_base._M_functor._M_unused._M_object = (_func_void *)0x0;
  local_40.what.super__Function_base._M_manager = (_Manager_type)0x0;
  local_40.what._M_invoker = p_Stack_48;
  if (local_50 != (_Manager_type)0x0) {
    local_40.what.super__Function_base._M_functor._M_unused._M_object = local_60._M_unused._M_object
    ;
    local_40.what.super__Function_base._M_manager = local_50;
    local_50 = (_Manager_type)0x0;
    p_Stack_48 = (_Invoker_type)0x0;
  }
  local_40.what.super__Function_base._M_functor._8_8_ = 0;
  next()::nxt = next()::nxt + 1;
  std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>::
  emplace_back<nrg::PrioExecution::QueueElement>(&queue->c,&local_40);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::PrioExecution::QueueElement*,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>>,std::greater<nrg::PrioExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_40.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.what.super__Function_base._M_manager)
              ((_Any_data *)&local_40.what,(_Any_data *)&local_40.what,__destroy_functor);
  }
  if (local_50 != (_Manager_type)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { 0, next(), std::move(fn) };
        push(queue, std::move(elem));
    }